

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::BindSparseResourceMemory
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this,
          BindSparseResourceMemoryAttribs *Attribs,int param_2)

{
  Uint32 *pUVar1;
  COMMAND_QUEUE_TYPE CVar2;
  bool bVar3;
  COMMAND_QUEUE_TYPE Type;
  COMMAND_QUEUE_TYPE extraout_DL;
  char (*in_R9) [8];
  string msg;
  string local_58;
  String local_38;
  
  Type = (COMMAND_QUEUE_TYPE)param_2;
  CVar2 = (this->m_Desc).QueueType;
  if (CVar2 == COMMAND_QUEUE_TYPE_UNKNOWN) {
    if ((this->m_Desc).IsDeferred == false) {
      FormatString<char[79]>
                (&local_58,
                 (char (*) [79])
                 "Queue type may never be unknown for immediate contexts. This looks like a bug.");
      DebugAssertionFailed
                (local_58._M_dataplus._M_p,"BindSparseResourceMemory",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
                 ,0x86e);
      std::__cxx11::string::~string((string *)&local_58);
    }
    FormatString<char[97]>
              (&local_58,
               (char (*) [97])
               "Queue type is UNKNOWN. This indicates that Begin() has never been called for a deferred context."
              );
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x86e);
    std::__cxx11::string::~string((string *)&local_58);
    CVar2 = (this->m_Desc).QueueType;
    Type = extraout_DL;
  }
  if ((CVar2 & COMMAND_QUEUE_TYPE_SPARSE_BINDING) == COMMAND_QUEUE_TYPE_UNKNOWN) {
    GetCommandQueueTypeString_abi_cxx11_(&local_38,(Diligent *)(ulong)CVar2,Type);
    FormatString<char[25],char[22],std::__cxx11::string,char[8]>
              (&local_58,(Diligent *)"BindSparseResourceMemory",(char (*) [25])0x65e20a,
               (char (*) [22])&local_38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)" queue.",in_R9)
    ;
    std::__cxx11::string::~string((string *)&local_38);
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x86e);
    std::__cxx11::string::~string((string *)&local_58);
  }
  if ((this->m_Desc).IsDeferred == true) {
    FormatString<char[73]>
              (&local_58,
               (char (*) [73])
               "BindSparseResourceMemory() should only be called for immediate contexts.");
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x870);
    std::__cxx11::string::~string((string *)&local_58);
  }
  if ((((this->m_pDevice).m_pObject)->
      super_RenderDeviceNextGenBase<Diligent::RenderDeviceBase<Diligent::EngineVkImplTraits>,_Diligent::ICommandQueueVk>
      ).super_RenderDeviceBase<Diligent::EngineVkImplTraits>.m_DeviceInfo.Features.SparseResources
      == DEVICE_FEATURE_STATE_DISABLED) {
    FormatString<char[82]>
              (&local_58,
               (char (*) [82])
               "IDeviceContext::BindSparseResourceMemory: SparseResources feature must be enabled");
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x871);
    std::__cxx11::string::~string((string *)&local_58);
  }
  if ((this->m_pActiveRenderPass).m_pObject != (RenderPassVkImpl *)0x0) {
    FormatString<char[57]>
              (&local_58,(char (*) [57])"Can not bind sparse memory inside an active render pass.");
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x872);
    std::__cxx11::string::~string((string *)&local_58);
  }
  bVar3 = VerifyBindSparseResourceMemoryAttribs
                    ((IRenderDevice *)(this->m_pDevice).m_pObject,Attribs);
  if (!bVar3) {
    FormatString<char[44]>(&local_58,(char (*) [44])"BindSparseResourceMemoryAttribs are invalid");
    DebugAssertionFailed
              (local_58._M_dataplus._M_p,"BindSparseResourceMemory",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x873);
    std::__cxx11::string::~string((string *)&local_58);
  }
  pUVar1 = &(this->m_Stats).CommandCounters.BindSparseResourceMemory;
  *pUVar1 = *pUVar1 + 1;
  return;
}

Assistant:

void DeviceContextBase<ImplementationTraits>::BindSparseResourceMemory(const BindSparseResourceMemoryAttribs& Attribs, int)
{
    DVP_CHECK_QUEUE_TYPE_COMPATIBILITY(COMMAND_QUEUE_TYPE_SPARSE_BINDING, "BindSparseResourceMemory");

    DEV_CHECK_ERR(!IsDeferred(), "BindSparseResourceMemory() should only be called for immediate contexts.");
    DEV_CHECK_ERR(m_pDevice->GetDeviceInfo().Features.SparseResources, "IDeviceContext::BindSparseResourceMemory: SparseResources feature must be enabled");
    DEV_CHECK_ERR(m_pActiveRenderPass == nullptr, "Can not bind sparse memory inside an active render pass.");
    DEV_CHECK_ERR(VerifyBindSparseResourceMemoryAttribs(m_pDevice, Attribs), "BindSparseResourceMemoryAttribs are invalid");

    ++m_Stats.CommandCounters.BindSparseResourceMemory;
}